

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  undefined1 *puVar1;
  LazyObject *pLVar2;
  
  this[-1].super_IfcGeometricRepresentationContext.WorldCoordinateSystem.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x927d88;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.field_0x70 =
       0x927e00;
  *(undefined8 *)((long)&this[-1].TargetView.field_2 + 8) = 0x927db0;
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x927dd8;
  puVar1 = (undefined1 *)
           (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
           ContextType.ptr.field_2._M_allocated_capacity;
  if ((bool *)puVar1 !=
      &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.ContextType.
       have) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             field_0x28;
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      puVar1 != &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                 ContextType) {
    operator_delete(puVar1);
  }
  this[-1].super_IfcGeometricRepresentationContext.WorldCoordinateSystem.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x927ea0;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.field_0x70 =
       0x927ef0;
  *(undefined8 *)((long)&this[-1].TargetView.field_2 + 8) = 0x927ec8;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x118 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x118);
  }
  this[-1].super_IfcGeometricRepresentationContext.WorldCoordinateSystem.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x927f18;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.field_0x70 =
       0x927f40;
  puVar1 = (undefined1 *)this[-1].TargetScale.ptr;
  if ((Out *)puVar1 != &this[-1].TargetView) {
    operator_delete(puVar1);
  }
  pLVar2 = this[-1].super_IfcGeometricRepresentationContext.TrueNorth.ptr.obj;
  if (pLVar2 != (LazyObject *)&this[-1].super_IfcGeometricRepresentationContext.field_0xa8) {
    operator_delete(pLVar2);
  }
  operator_delete(&this[-1].super_IfcGeometricRepresentationContext.WorldCoordinateSystem);
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}